

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  FieldDescriptor *pFVar1;
  float f;
  double f_00;
  FieldDescriptor FVar2;
  string *enum_name;
  long lVar3;
  int iVar4;
  Descriptor *pDVar5;
  EnumValueDescriptor *pEVar6;
  undefined8 *puVar7;
  char *pcVar8;
  long *plVar9;
  LogMessage *other;
  _func_int **pp_Var10;
  size_type *psVar11;
  EnumDescriptor *descriptor_00;
  code *pcVar12;
  FieldGeneratorBase *this_00;
  _func_int **pp_Var13;
  FieldDescriptor *pFVar14;
  undefined8 uVar15;
  undefined1 local_98 [32];
  undefined1 local_78 [56];
  string local_40;
  
  this_00 = this;
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    this_00 = (FieldGeneratorBase *)local_78;
    local_78._0_8_ = FieldDescriptor::TypeOnceInit;
    local_98._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)this_00,
               (FieldDescriptor **)local_98);
  }
  switch(descriptor[2]) {
  case (FieldDescriptor)0x1:
    f_00 = *(double *)(descriptor + 0x40);
    if (INFINITY <= f_00) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = (code *)0x407055;
      pp_Var13 = (_func_int **)"double.PositiveInfinity";
      goto LAB_002c2726;
    }
    if (f_00 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = (code *)0x40706d;
      pp_Var13 = (_func_int **)"double.NegativeInfinity";
      goto LAB_002c2726;
    }
    if (NAN(f_00)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = (code *)0x407078;
      pp_Var13 = (_func_int **)"double.NaN";
      goto LAB_002c2726;
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)local_78,f_00);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((string *)local_78._8_8_)->_M_dataplus)._M_p + local_78._0_8_));
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"D"
                  );
    goto LAB_002c2633;
  case (FieldDescriptor)0x2:
    f = *(float *)(descriptor + 0x40);
    if (INFINITY <= f) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = (code *)0x40708f;
      pp_Var13 = (_func_int **)"float.PositiveInfinity";
      goto LAB_002c2726;
    }
    if (f <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = (code *)0x4070a6;
      pp_Var13 = (_func_int **)"float.NegativeInfinity";
      goto LAB_002c2726;
    }
    if (NAN(f)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = (code *)0x4070b0;
      pp_Var13 = (_func_int **)"float.NaN";
      goto LAB_002c2726;
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)local_78,f);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((string *)local_78._8_8_)->_M_dataplus)._M_p + local_78._0_8_));
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"F"
                  );
    goto LAB_002c2633;
  case (FieldDescriptor)0x3:
    pp_Var13 = (_func_int **)(local_78 + 0x10);
    local_78._0_8_ = pp_Var13;
    pcVar8 = FastInt64ToBufferLeft(*(int64 *)(descriptor + 0x40),(char *)pp_Var13);
    local_78._8_8_ = pcVar8 + -(long)pp_Var13;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((Options *)local_78._8_8_)->file_extension)._M_dataplus._M_p +
                       local_78._0_8_));
    plVar9 = (long *)std::__cxx11::string::append(local_98);
    break;
  case (FieldDescriptor)0x4:
    pp_Var13 = (_func_int **)(local_78 + 0x10);
    local_78._0_8_ = pp_Var13;
    pcVar8 = FastUInt64ToBufferLeft(*(uint64 *)(descriptor + 0x40),(char *)pp_Var13);
    local_78._8_8_ = pcVar8 + -(long)pp_Var13;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((Options *)local_78._8_8_)->file_extension)._M_dataplus._M_p +
                       local_78._0_8_));
    plVar9 = (long *)std::__cxx11::string::append(local_98);
    break;
  case (FieldDescriptor)0x5:
  case (FieldDescriptor)0xf:
  case (FieldDescriptor)0x11:
    local_78._0_8_ = local_78 + 0x10;
    pcVar8 = FastInt32ToBufferLeft(*(int32 *)(descriptor + 0x40),(char *)local_78._0_8_);
    goto LAB_002c2329;
  case (FieldDescriptor)0x6:
    pp_Var13 = (_func_int **)(local_78 + 0x10);
    local_78._0_8_ = pp_Var13;
    pcVar8 = FastUInt64ToBufferLeft(*(uint64 *)(descriptor + 0x40),(char *)pp_Var13);
    local_78._8_8_ = pcVar8 + -(long)pp_Var13;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((Options *)local_78._8_8_)->file_extension)._M_dataplus._M_p +
                       local_78._0_8_));
    plVar9 = (long *)std::__cxx11::string::append(local_98);
    break;
  case (FieldDescriptor)0x7:
  case (FieldDescriptor)0xd:
    local_78._0_8_ = local_78 + 0x10;
    pcVar8 = FastUInt32ToBufferLeft(*(uint32 *)(descriptor + 0x40),(char *)local_78._0_8_);
LAB_002c2329:
    local_78._8_8_ = pcVar8 + -(long)(local_78 + 0x10);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = (code *)((long)&(((Options *)local_78._8_8_)->file_extension)._M_dataplus._M_p +
                      local_78._0_8_);
    pp_Var13 = (_func_int **)local_78._0_8_;
    goto LAB_002c2726;
  case (FieldDescriptor)0x8:
    FVar2 = descriptor[0x40];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (FVar2 == (FieldDescriptor)0x1) {
      pcVar12 = (code *)0x3e578f;
      pp_Var13 = (_func_int **)"true";
    }
    else {
      pcVar12 = (code *)0x3e5795;
      pp_Var13 = (_func_int **)"false";
    }
    goto LAB_002c2726;
  case (FieldDescriptor)0x9:
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this_00,descriptor);
    return __return_storage_ptr__;
  case (FieldDescriptor)0xa:
  case (FieldDescriptor)0xb:
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_78._0_8_ = FieldDescriptor::TypeOnceInit;
      local_98._0_8_ = descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_78,
                 (FieldDescriptor **)local_98);
    }
    if (descriptor[2] == (FieldDescriptor)0xb) {
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar4 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar5 + 0x10));
      if (iVar4 == 0) {
        pDVar5 = FieldDescriptor::message_type(descriptor);
        default_value_abi_cxx11_(__return_storage_ptr__,this,*(FieldDescriptor **)(pDVar5 + 0x28));
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pp_Var13 = (_func_int **)0x3ebbe5;
    pcVar12 = (code *)0x3ebbe9;
    goto LAB_002c2726;
  case (FieldDescriptor)0xc:
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this_00,descriptor);
    return __return_storage_ptr__;
  case (FieldDescriptor)0xe:
    pEVar6 = FieldDescriptor::default_value_enum(descriptor);
    GetClassName_abi_cxx11_((string *)local_98,*(csharp **)(pEVar6 + 0x10),descriptor_00);
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_98);
    pp_Var13 = (_func_int **)(local_78 + 0x10);
    pp_Var10 = (_func_int **)(puVar7 + 2);
    if ((_func_int **)*puVar7 == pp_Var10) {
      local_78._16_8_ = *pp_Var10;
      local_78._24_8_ = puVar7[3];
      local_78._0_8_ = pp_Var13;
    }
    else {
      local_78._16_8_ = *pp_Var10;
      local_78._0_8_ = (_func_int **)*puVar7;
    }
    local_78._8_8_ = puVar7[1];
    *puVar7 = pp_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    pEVar6 = FieldDescriptor::default_value_enum(descriptor);
    enum_name = *(string **)(*(long *)(pEVar6 + 0x10) + 8);
    pEVar6 = FieldDescriptor::default_value_enum(descriptor);
    GetEnumValueName(&local_40,enum_name,*(string **)(pEVar6 + 8));
    pFVar1 = (FieldDescriptor *)
             ((long)&(((string *)local_78._8_8_)->_M_dataplus)._M_p +
             (long)(_Rb_tree_color *)local_40._M_string_length);
    pFVar14 = (FieldDescriptor *)0xf;
    if ((_func_int **)local_78._0_8_ != pp_Var13) {
      pFVar14 = (FieldDescriptor *)local_78._16_8_;
    }
    if (pFVar14 < pFVar1) {
      uVar15 = (FieldDescriptor *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        uVar15 = local_40.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < pFVar1) goto LAB_002c27df;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,local_78._0_8_);
    }
    else {
LAB_002c27df:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append(local_78,(ulong)local_40._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = puVar7 + 2;
    if ((size_type *)*puVar7 == psVar11) {
      uVar15 = puVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar15;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = puVar7[1];
    *puVar7 = psVar11;
    puVar7[1] = 0;
    *(undefined1 *)psVar11 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((_func_int **)local_78._0_8_ != pp_Var13) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((FieldDescriptor *)local_98._0_8_ == (FieldDescriptor *)(local_98 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_002c2640;
  case (FieldDescriptor)0x10:
    pp_Var13 = (_func_int **)(local_78 + 0x10);
    local_78._0_8_ = pp_Var13;
    pcVar8 = FastInt64ToBufferLeft(*(int64 *)(descriptor + 0x40),(char *)pp_Var13);
    local_78._8_8_ = pcVar8 + -(long)pp_Var13;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((Options *)local_78._8_8_)->file_extension)._M_dataplus._M_p +
                       local_78._0_8_));
    plVar9 = (long *)std::__cxx11::string::append(local_98);
    break;
  case (FieldDescriptor)0x12:
    pp_Var13 = (_func_int **)(local_78 + 0x10);
    local_78._0_8_ = pp_Var13;
    pcVar8 = FastInt64ToBufferLeft(*(int64 *)(descriptor + 0x40),(char *)pp_Var13);
    local_78._8_8_ = pcVar8 + -(long)pp_Var13;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_78._0_8_,
               (code *)((long)&(((Options *)local_78._8_8_)->file_extension)._M_dataplus._M_p +
                       local_78._0_8_));
    plVar9 = (long *)std::__cxx11::string::append(local_98);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x193);
    other = internal::LogMessage::operator<<((LogMessage *)local_78,"Unknown field type.");
    internal::LogFinisher::operator=((LogFinisher *)local_98,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = (code *)0x3e25d9;
    pp_Var13 = (_func_int **)0x3e25d9;
LAB_002c2726:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pp_Var13,pcVar12);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar11) {
    lVar3 = plVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
LAB_002c2633:
  if ((FieldDescriptor *)local_98._0_8_ == (FieldDescriptor *)(local_98 + 0x10)) {
    return __return_storage_ptr__;
  }
LAB_002c2640:
  operator_delete((void *)local_98._0_8_);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->default_value_enum()->type()) + "." +
        GetEnumValueName(descriptor->default_value_enum()->type()->name(), descriptor->default_value_enum()->name());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return StrCat(value) + "D";
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return StrCat(value) + "F";
    }
    case FieldDescriptor::TYPE_INT64:
      return StrCat(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_UINT64:
      return StrCat(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_INT32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return StrCat(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_FIXED32:
      return StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return StrCat(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_SINT32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return StrCat(descriptor->default_value_int64()) + "L";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}